

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.h
# Opt level: O0

float CB_ALGS::get_cost_pred<true>
                (single_learner *scorer,cb_class *known_cost,example *ec,uint32_t index,
                uint32_t base)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int in_ECX;
  long in_RDX;
  undefined4 *in_RSI;
  float pred;
  float old_weight;
  polyprediction p;
  bool baseline_enabled_old;
  label_data simple_temp;
  label ld;
  size_t i;
  example *ec_00;
  learner<char,_example> *this;
  undefined4 local_4c;
  uint in_stack_ffffffffffffffb8;
  undefined4 uVar7;
  example *ec_01;
  
  ec_01 = *(example **)(in_RDX + 0x6828);
  uVar2 = *(undefined8 *)(in_RDX + 0x6830);
  uVar3 = *(undefined8 *)(in_RDX + 0x6838);
  uVar4 = *(undefined8 *)(in_RDX + 0x6840);
  uVar7 = 0;
  if ((in_RSI == (undefined4 *)0x0) || (in_ECX != in_RSI[1])) {
    local_4c = 0x7f7fffff;
  }
  else {
    local_4c = *in_RSI;
  }
  bVar6 = BASELINE::baseline_enabled((example *)(ulong)in_stack_ffffffffffffffb8);
  BASELINE::set_baseline_enabled(ec_01);
  *(ulong *)(in_RDX + 0x6828) = CONCAT44(in_stack_ffffffffffffffb8,local_4c);
  *(undefined4 *)(in_RDX + 0x6830) = uVar7;
  i = *(size_t *)(in_RDX + 0x6850);
  ec_00 = *(example **)(in_RDX + 0x6858);
  this = *(learner<char,_example> **)(in_RDX + 0x6860);
  uVar5 = *(undefined8 *)(in_RDX + 0x6868);
  if ((in_RSI == (undefined4 *)0x0) || (in_ECX != in_RSI[1])) {
    LEARNER::learner<char,_example>::predict(this,ec_00,i);
  }
  else {
    uVar7 = *(undefined4 *)(in_RDX + 0x6870);
    *(float *)(in_RDX + 0x6870) = *(float *)(in_RDX + 0x6870) / (float)in_RSI[2];
    LEARNER::learner<char,_example>::learn(this,ec_00,i);
    *(undefined4 *)(in_RDX + 0x6870) = uVar7;
  }
  if (!bVar6) {
    BASELINE::reset_baseline_disabled(ec_01);
  }
  fVar1 = *(float *)(in_RDX + 0x6850);
  *(size_t *)(in_RDX + 0x6850) = i;
  *(example **)(in_RDX + 0x6858) = ec_00;
  *(learner<char,_example> **)(in_RDX + 0x6860) = this;
  *(undefined8 *)(in_RDX + 0x6868) = uVar5;
  *(example **)(in_RDX + 0x6828) = ec_01;
  *(undefined8 *)(in_RDX + 0x6830) = uVar2;
  *(undefined8 *)(in_RDX + 0x6838) = uVar3;
  *(undefined8 *)(in_RDX + 0x6840) = uVar4;
  return fVar1;
}

Assistant:

float get_cost_pred(
    LEARNER::single_learner* scorer, CB::cb_class* known_cost, example& ec, uint32_t index, uint32_t base)
{
  CB::label ld = ec.l.cb;

  label_data simple_temp;
  simple_temp.initial = 0.;
  if (known_cost != nullptr && index == known_cost->action)
    simple_temp.label = known_cost->cost;
  else
    simple_temp.label = FLT_MAX;

  const bool baseline_enabled_old = BASELINE::baseline_enabled(&ec);
  BASELINE::set_baseline_enabled(&ec);
  ec.l.simple = simple_temp;
  polyprediction p = ec.pred;
  if (is_learn && known_cost != nullptr && index == known_cost->action)
  {
    float old_weight = ec.weight;
    ec.weight /= known_cost->probability;
    scorer->learn(ec, index - 1 + base);
    ec.weight = old_weight;
  }
  else
    scorer->predict(ec, index - 1 + base);

  if (!baseline_enabled_old)
    BASELINE::reset_baseline_disabled(&ec);
  float pred = ec.pred.scalar;
  ec.pred = p;

  ec.l.cb = ld;

  return pred;
}